

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeArray * __thiscall
ExpressionContext::GetArrayType(ExpressionContext *this,TypeBase *type,longlong length)

{
  bool bVar1;
  ExpressionContext *this_00;
  IntrusiveList<TypeHandle> *this_01;
  TypeHandle *this_02;
  uint local_84;
  byte local_72;
  byte local_71;
  ExpressionContext *local_68;
  uint local_5c;
  undefined1 auStack_58 [4];
  uint maximumAlignment;
  ExpressionContext *local_48;
  TypeArray *result;
  TypeArray *typeArray;
  TypeHandle *curr;
  TypeClass *typeClass;
  longlong length_local;
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  typeClass = (TypeClass *)length;
  length_local = (longlong)type;
  type_local = (TypeBase *)this;
  if (type == this->typeVoid) {
    __assert_fail("type != typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6a1,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  if (type != this->typeAuto) {
    bVar1 = isType<TypeArgumentSet>(type);
    local_71 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>((TypeBase *)length_local);
      local_71 = 0;
      if (!bVar1) {
        bVar1 = isType<TypeFunctionSet>((TypeBase *)length_local);
        local_71 = bVar1 ^ 0xff;
      }
    }
    if ((local_71 & 1) != 0) {
      bVar1 = isType<TypeError>((TypeBase *)length_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!isType<TypeError>(type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x6a8,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
      }
      curr = (TypeHandle *)getType<TypeClass>((TypeBase *)length_local);
      if ((TypeClass *)curr != (TypeClass *)0x0) {
        local_72 = 0;
        if ((((TypeClass *)curr)->completed & 1U) != 0) {
          local_72 = ((TypeClass *)curr)->hasFinalizer ^ 0xff;
        }
        if ((local_72 & 1) == 0) {
          __assert_fail("typeClass->completed && !typeClass->hasFinalizer",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x6ae,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
        }
      }
      typeArray = *(TypeArray **)(length_local + 0x48);
      while( true ) {
        if (typeArray == (TypeArray *)0x0) {
          if (*(long *)(length_local + 0x30) < 0x10000) {
            this_00 = (ExpressionContext *)get<TypeArray>(this);
            _auStack_58 = GetArrayTypeName(this,(TypeBase *)length_local,(longlong)typeClass);
            TypeArray::TypeArray
                      ((TypeArray *)this_00,_auStack_58,(TypeBase *)length_local,(longlong)typeClass
                      );
            (this_00->uniqueDependencies).max = *(uint *)(length_local + 0x2c);
            if ((this_00->uniqueDependencies).max < 4) {
              local_84 = 4;
            }
            else {
              local_84 = (this_00->uniqueDependencies).max;
            }
            local_5c = local_84;
            if ((long)(this_00->uniqueDependencies).little[0] % (long)(ulong)local_84 != 0) {
              *(uint *)((this_00->uniqueDependencies).little + 1) =
                   local_84 -
                   (int)((long)(this_00->uniqueDependencies).little[0] % (long)(ulong)local_84);
              (this_00->uniqueDependencies).little[0] =
                   (ModuleData *)
                   ((long)&(this_00->uniqueDependencies).little[0]->source +
                   (ulong)*(uint *)((this_00->uniqueDependencies).little + 1));
            }
            this_01 = (IntrusiveList<TypeHandle> *)(length_local + 0x48);
            local_48 = this_00;
            this_02 = get<TypeHandle>(this);
            TypeHandle::TypeHandle(this_02,(TypeBase *)local_48);
            IntrusiveList<TypeHandle>::push_back(this_01,this_02);
            local_68 = local_48;
            SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_68);
            return (TypeArray *)local_48;
          }
          __assert_fail("type->size < 64 * 1024",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x6ba,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
        }
        result = getType<TypeArray>((TypeBase *)(typeArray->super_TypeBase)._vptr_TypeBase);
        if ((result != (TypeArray *)0x0) && ((TypeClass *)result->length == typeClass)) break;
        typeArray = *(TypeArray **)&(typeArray->super_TypeBase).typeID;
      }
      return result;
    }
    __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6a7,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  __assert_fail("type != typeAuto",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x6a4,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
}

Assistant:

TypeArray* ExpressionContext::GetArrayType(TypeBase* type, long long length)
{
	// Can't have array of void
	assert(type != typeVoid);

	// Can't have array of auto
	assert(type != typeAuto);

	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		(void)typeClass;

		assert(typeClass->completed && !typeClass->hasFinalizer);
	}

	for(TypeHandle *curr = type->arrayTypes.head; curr; curr = curr->next)
	{
		if(TypeArray *typeArray = getType<TypeArray>(curr->type))
		{
			if(typeArray->length == length)
				return typeArray;
		}
	}

	assert(type->size < 64 * 1024);

	// Create new type
	TypeArray* result = new (get<TypeArray>()) TypeArray(GetArrayTypeName(*this, type, length), type, length);

	result->alignment = type->alignment;

	unsigned maximumAlignment = result->alignment < 4 ? 4 : result->alignment;

	if(result->size % maximumAlignment != 0)
	{
		result->padding = maximumAlignment - (result->size % maximumAlignment);
		result->size += result->padding;
	}

	// Save it for future use
	type->arrayTypes.push_back(new (get<TypeHandle>()) TypeHandle(result));

	types.push_back(result);

	return result;
}